

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O2

int main(void)

{
  SqStack P;
  SqStack P_00;
  SqStack P_01;
  SqStack P_02;
  SqStack S_00;
  SqStack s;
  undefined8 uStack_40;
  SqStack S;
  SqStack local_20;
  
  S_00.top = S.base;
  S_00.base = (ElementType *)uStack_40;
  S_00._16_8_ = S.top;
  InitStack(S_00);
  P.top = local_20.top;
  P.base = local_20.base;
  P.stacksize = local_20.stacksize;
  P._20_4_ = local_20._20_4_;
  Push(&local_20,P,1);
  P_00.top = local_20.top;
  P_00.base = local_20.base;
  P_00.stacksize = local_20.stacksize;
  P_00._20_4_ = local_20._20_4_;
  Push(&local_20,P_00,2);
  P_01.top = local_20.top;
  P_01.base = local_20.base;
  P_01.stacksize = local_20.stacksize;
  P_01._20_4_ = local_20._20_4_;
  Push(&local_20,P_01,3);
  P_02.top = local_20.top;
  P_02.base = local_20.base;
  P_02.stacksize = local_20.stacksize;
  P_02._20_4_ = local_20._20_4_;
  Push(&local_20,P_02,4);
  s.top = local_20.base;
  s.base = (ElementType *)uStack_40;
  s._16_8_ = local_20.top;
  PrintStackData(s);
  conversion();
  LineEdit();
  return 0;
}

Assistant:

int main(){
    SqStack S;
    S = InitStack(S);
    S = Push(S,1);
    S = Push(S,2);
    S = Push(S,3);
    S = Push(S,4);
    PrintStackData(S);
    conversion(10);
    LineEdit();
    return 0;
}